

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O0

void __thiscall
zmq::stream_engine_base_t::plug
          (stream_engine_base_t *this,io_thread_t *io_thread_,session_base_t *session_)

{
  socket_base_t *psVar1;
  _func_int **pp_Var2;
  poller_t *in_RDX;
  io_object_t *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  fd_t in_stack_ffffffffffffffdc;
  
  if (((ulong)in_RDI[0x5f]._poller & 1) != 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_plugged",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0xb6);
    fflush(_stderr);
    zmq_abort((char *)0x239019);
  }
  *(undefined1 *)&in_RDI[0x5f]._poller = 1;
  if (in_RDI[100]._poller != (poller_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_session",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0xba);
    fflush(_stderr);
    zmq_abort((char *)0x239088);
  }
  if (in_RDX == (poller_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","session_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0xbb);
    fflush(_stderr);
    zmq_abort((char *)0x2390e4);
  }
  in_RDI[100]._poller = in_RDX;
  psVar1 = session_base_t::get_socket((session_base_t *)in_RDI[100]._poller);
  in_RDI[0x65].super_i_poll_events._vptr_i_poll_events = (_func_int **)psVar1;
  io_object_t::plug(in_RDI,(io_thread_t *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  pp_Var2 = (_func_int **)io_object_t::add_fd(in_RDI,in_stack_ffffffffffffffdc);
  in_RDI[0x5f].super_i_poll_events._vptr_i_poll_events = pp_Var2;
  *(undefined1 *)&in_RDI[100].super_i_poll_events._vptr_i_poll_events = 0;
  (*(in_RDI->super_i_poll_events)._vptr_i_poll_events[0xf])();
  return;
}

Assistant:

void zmq::stream_engine_base_t::plug (io_thread_t *io_thread_,
                                      session_base_t *session_)
{
    zmq_assert (!_plugged);
    _plugged = true;

    //  Connect to session object.
    zmq_assert (!_session);
    zmq_assert (session_);
    _session = session_;
    _socket = _session->get_socket ();

    //  Connect to I/O threads poller object.
    io_object_t::plug (io_thread_);
    _handle = add_fd (_s);
    _io_error = false;

    plug_internal ();
}